

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

Client __thiscall capnp::TwoPartyClient::bootstrap(TwoPartyClient *this)

{
  StructDataBitCount *this_00;
  Reader vatId_00;
  Side SVar1;
  ClientHook *extraout_RDX;
  TwoPartyVatNetwork *in_RSI;
  Client CVar2;
  Reader local_170;
  undefined1 local_130 [8];
  Builder vatId;
  MallocMessageBuilder message;
  TwoPartyClient *this_local;
  
  this_00 = &vatId._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,4,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::rpc::twoparty::VatId>
            ((Builder *)local_130,(MessageBuilder *)this_00);
  SVar1 = TwoPartyVatNetwork::getSide(in_RSI);
  rpc::twoparty::VatId::Builder::setSide((Builder *)local_130,(ushort)(SVar1 != CLIENT));
  rpc::twoparty::VatId::Builder::operator_cast_to_Reader(&local_170,(Builder *)local_130);
  vatId_00._reader.capTable = local_170._reader.capTable;
  vatId_00._reader.segment = local_170._reader.segment;
  vatId_00._reader.data = local_170._reader.data;
  vatId_00._reader.pointers = local_170._reader.pointers;
  vatId_00._reader.dataSize = local_170._reader.dataSize;
  vatId_00._reader.pointerCount = local_170._reader.pointerCount;
  vatId_00._reader._38_2_ = local_170._reader._38_2_;
  vatId_00._reader.nestingLimit = local_170._reader.nestingLimit;
  vatId_00._reader._44_4_ = local_170._reader._44_4_;
  RpcSystem<capnp::rpc::twoparty::VatId>::bootstrap
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)this,vatId_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&vatId._builder.dataSize);
  CVar2.hook.ptr = extraout_RDX;
  CVar2.hook.disposer = (Disposer *)this;
  return (Client)CVar2.hook;
}

Assistant:

Capability::Client TwoPartyClient::bootstrap() {
  MallocMessageBuilder message(4);
  auto vatId = message.getRoot<rpc::twoparty::VatId>();
  vatId.setSide(network.getSide() == rpc::twoparty::Side::CLIENT
                ? rpc::twoparty::Side::SERVER
                : rpc::twoparty::Side::CLIENT);
  return rpcSystem.bootstrap(vatId);
}